

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statemachine.cpp
# Opt level: O2

callback_t *
begin_class_state(callback_t *__return_storage_ptr__,MetaConfiguration *conf,ifstream *f,int *error)

{
  long lVar1;
  QDebug *pQVar2;
  MetaConfiguration *s;
  shared_ptr<MetaClass> old_parent;
  shared_ptr<MetaClass> local_50;
  undefined1 local_40 [20];
  undefined4 local_2c;
  undefined8 local_28;
  
  s = conf;
  parser();
  if ((parser()::category[0x10] & 1) != 0) {
    parser();
    local_40._0_4_ = 2;
    local_40._4_8_ = 0;
    local_40._12_8_ = 0;
    local_2c = 0;
    local_28 = parser()::category._8_8_;
    QMessageLogger::debug();
    pQVar2 = QDebug::operator<<((QDebug *)&local_50,"Starting class: ");
    s = (MetaConfiguration *)&(anonymous_namespace)::global_string_abi_cxx11_;
    operator<<(pQVar2,(string *)&(anonymous_namespace)::global_string_abi_cxx11_);
    QDebug::~QDebug((QDebug *)&local_50);
  }
  std::istream::ignore();
  clear_empty(f);
  anon_unknown.dwarf_1f3b3::trim
            ((anon_unknown_dwarf_1f3b3 *)&(anonymous_namespace)::global_string_abi_cxx11_,
             (string *)s);
  if ((conf->top_level_class).super___shared_ptr<MetaClass,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    parser();
    if ((parser()::category[0x10] & 1) != 0) {
      parser();
      local_40._0_4_ = 2;
      local_40._4_8_ = 0;
      local_40._12_8_ = 0;
      local_2c = 0;
      local_28 = parser()::category._8_8_;
      QMessageLogger::debug();
      QDebug::operator<<((QDebug *)&local_50,"Creating the top level class");
      QDebug::~QDebug((QDebug *)&local_50);
    }
    std::make_shared<MetaClass>();
    std::__shared_ptr<MetaClass,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(conf->top_level_class).super___shared_ptr<MetaClass,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<MetaClass,_(__gnu_cxx::_Lock_policy)2> *)local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_40 + 8));
    std::__shared_ptr<MetaClass,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<MetaClass,_(__gnu_cxx::_Lock_policy)2> *)
               &(anonymous_namespace)::current_class,
               &(conf->top_level_class).super___shared_ptr<MetaClass,_(__gnu_cxx::_Lock_policy)2>);
  }
  else {
    if ((anonymous_namespace)::current_class == 0) {
      __assert_fail("current_class",
                    "/workspace/llm4binary/github/license_c_cmakelists/tcanabrava[P]configuration-parser/parser/statemachine.cpp"
                    ,0x86,
                    "callback_t begin_class_state(MetaConfiguration &, std::ifstream &, int &)");
    }
    parser();
    if ((parser()::category[0x10] & 1) != 0) {
      parser();
      local_40._0_4_ = 2;
      local_40._4_8_ = 0;
      local_40._12_8_ = 0;
      local_2c = 0;
      local_28 = parser()::category._8_8_;
      QMessageLogger::debug();
      pQVar2 = QDebug::operator<<((QDebug *)&local_50,"Creating a child class of");
      operator<<(pQVar2,(string *)((anonymous_namespace)::current_class + 0x40));
      QDebug::~QDebug((QDebug *)&local_50);
    }
    std::__shared_ptr<MetaClass,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<MetaClass,_(__gnu_cxx::_Lock_policy)2> *)local_40,
               (__shared_ptr<MetaClass,_(__gnu_cxx::_Lock_policy)2> *)
               &(anonymous_namespace)::current_class);
    lVar1 = (anonymous_namespace)::current_class;
    std::make_shared<MetaClass>();
    std::vector<std::shared_ptr<MetaClass>,std::allocator<std::shared_ptr<MetaClass>>>::
    emplace_back<std::shared_ptr<MetaClass>>
              ((vector<std::shared_ptr<MetaClass>,std::allocator<std::shared_ptr<MetaClass>>> *)
               (lVar1 + 0x18),&local_50);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_50.super___shared_ptr<MetaClass,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__shared_ptr<MetaClass,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<MetaClass,_(__gnu_cxx::_Lock_policy)2> *)
               &(anonymous_namespace)::current_class,
               (__shared_ptr<MetaClass,_(__gnu_cxx::_Lock_policy)2> *)
               (*(long *)((anonymous_namespace)::current_class + 0x20) + -0x10));
    std::__shared_ptr<MetaClass,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<MetaClass,_(__gnu_cxx::_Lock_policy)2> *)
               ((anonymous_namespace)::current_class + 0x30),
               (__shared_ptr<MetaClass,_(__gnu_cxx::_Lock_policy)2> *)local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_40 + 8));
  }
  std::__cxx11::string::_M_assign((string *)((anonymous_namespace)::current_class + 0x40));
  parser();
  if ((parser()::category[0x10] & 1) != 0) {
    parser();
    local_40._0_4_ = 2;
    local_40._4_8_ = 0;
    local_40._12_8_ = 0;
    local_2c = 0;
    local_28 = parser()::category._8_8_;
    QMessageLogger::debug();
    pQVar2 = QDebug::operator<<((QDebug *)&local_50,"class found: ");
    pQVar2 = operator<<(pQVar2,(string *)((anonymous_namespace)::current_class + 0x40));
    pQVar2 = QDebug::operator<<(pQVar2,", value = ");
    operator<<(pQVar2,(string *)(anonymous_namespace)::array_value_abi_cxx11_);
    QDebug::~QDebug((QDebug *)&local_50);
  }
  DAT_00113318 = 0;
  *(anonymous_namespace)::global_string_abi_cxx11_ = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
  *(code **)&(__return_storage_ptr__->super__Function_base)._M_functor = class_state;
  __return_storage_ptr__->_M_invoker =
       std::
       _Function_handler<RecursiveHelper<MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&>_(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&),_std::function<RecursiveHelper<MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&>_(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&)>_(*)(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&)>
       ::_M_invoke;
  (__return_storage_ptr__->super__Function_base)._M_manager =
       std::
       _Function_handler<RecursiveHelper<MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&>_(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&),_std::function<RecursiveHelper<MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&>_(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&)>_(*)(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&)>
       ::_M_manager;
  return __return_storage_ptr__;
}

Assistant:

callback_t begin_class_state(MetaConfiguration &conf, std::ifstream &f,
                             int &error) {
  qCDebug(parser) << "Starting class: " << global_string;

  f.ignore(); // eat the '{' character.
  clear_empty(f);
  trim(global_string);

  if (!conf.top_level_class) {
    qCDebug(parser) << "Creating the top level class";
    conf.top_level_class = std::make_shared<MetaClass>();
    current_class = conf.top_level_class;
  } else {
    assert(current_class);
    qCDebug(parser) << "Creating a child class of" << current_class->name;
    auto old_parent = current_class;
    current_class->subclasses.push_back(std::make_shared<MetaClass>());
    current_class = current_class->subclasses.back();
    current_class->parent = old_parent;
  }
  current_class->name = global_string;

  qCDebug(parser) << "class found: " << current_class->name
                  << ", value = " << array_value;

  global_string.clear();
  return class_state;
}